

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O2

Bool prvTidyFixDocType(TidyDocImpl *doc)

{
  Lexer *pLVar1;
  ulong uVar2;
  uint uVar3;
  uint vers;
  Node *element;
  AttVal *pAVar4;
  tmbstr ptVar5;
  ctmbstr ptVar6;
  int iVar7;
  bool bVar8;
  
  pLVar1 = doc->lexer;
  element = prvTidyFindDocType(doc);
  uVar2 = (doc->config).value[0xe].v;
  iVar7 = (int)uVar2;
  if (iVar7 == 2 && element != (Node *)0x0) {
    uVar3 = pLVar1->doctype;
    if (uVar3 == 0x60000) {
      pLVar1->versionEmitted = 0x20000;
      return yes;
    }
LAB_0013ff8f:
    if ((pLVar1->versions & uVar3) != 0) {
      if ((uVar3 & 0x41f00) == 0) {
        if (element != (Node *)0x0) goto LAB_0013ffd1;
      }
      else if ((element != (Node *)0x0) && (pLVar1->isvoyager != no)) {
LAB_0013ffd1:
        pLVar1->versionEmitted = uVar3;
        return yes;
      }
    }
  }
  else {
    if (iVar7 == 2) {
      uVar3 = pLVar1->doctype;
      goto LAB_0013ff8f;
    }
    if (iVar7 == 1) {
      if (element != (Node *)0x0) {
        prvTidyDiscardElement(doc,element);
      }
      uVar3 = prvTidyApparentVersion(doc);
      goto LAB_0013ffd1;
    }
  }
  if (*(int *)((doc->config).value + 100) != 0) {
    return yes;
  }
  if (element == (Node *)0x0) {
    bVar8 = true;
LAB_0014002c:
    element = (Node *)0x0;
  }
  else {
    pAVar4 = prvTidyGetAttrByName(element,"SYSTEM");
    bVar8 = pAVar4 == (AttVal *)0x0;
    if (iVar7 - 3U < 2) {
      prvTidyDiscardElement(doc,element);
      goto LAB_0014002c;
    }
  }
  switch(uVar2 & 0xffffffff) {
  case 0:
    vers = 0x20000;
    break;
  default:
    pLVar1->versionEmitted = 0;
    return no;
  case 2:
    vers = prvTidyHTMLVersion(doc);
    pLVar1->versionEmitted = vers;
    if (vers == 0) {
      return no;
    }
    goto LAB_0014007a;
  case 3:
    vers = 0x20;
    break;
  case 4:
    vers = 0x40;
  }
  pLVar1->versionEmitted = vers;
LAB_0014007a:
  if (element == (Node *)0x0) {
    element = NewDocTypeNode(doc);
    ptVar5 = prvTidytmbstrdup(doc->allocator,"html");
  }
  else {
    ptVar5 = prvTidytmbstrtolower(element->element);
  }
  element->element = ptVar5;
  ptVar6 = GetFPIFromVers(vers);
  prvTidyRepairAttrValue(doc,element,"PUBLIC",ptVar6);
  if (!bVar8) {
    ptVar6 = GetSIFromVers(vers);
    prvTidyRepairAttrValue(doc,element,"SYSTEM",ptVar6);
  }
  return yes;
}

Assistant:

Bool TY_(FixDocType)( TidyDocImpl* doc )
{
    Lexer* lexer = doc->lexer;
    Node* doctype = TY_(FindDocType)( doc );
    uint dtmode = cfg( doc, TidyDoctypeMode );
    uint guessed = VERS_UNKNOWN;
    Bool hadSI = no;

    /* Issue #167 - found doctype, and doctype is default VERS_HTML5, set VERS_HTML5 and return yes */
    if (doctype && (dtmode == TidyDoctypeAuto) &&
        (lexer->doctype == VERS_HTML5) )
    {
        /* The version emitted cannot be a composite value! */
        lexer->versionEmitted = HT50;
        return yes;
    }
    if (dtmode == TidyDoctypeAuto &&
        lexer->versions & lexer->doctype &&
        !(VERS_XHTML & lexer->doctype && !lexer->isvoyager)
        && TY_(FindDocType)(doc))
    {
        lexer->versionEmitted = lexer->doctype;
        return yes;
    }

    if (dtmode == TidyDoctypeOmit)
    {
        if (doctype)
            TY_(DiscardElement)( doc, doctype );
        lexer->versionEmitted = TY_(ApparentVersion)( doc );
        return yes;
    }

    if (cfgBool(doc, TidyXmlOut))
        return yes;

    if (doctype)
        hadSI = TY_(GetAttrByName)(doctype, "SYSTEM") != NULL;

    if ((dtmode == TidyDoctypeStrict ||
         dtmode == TidyDoctypeLoose) && doctype)
    {
        TY_(DiscardElement)(doc, doctype);
        doctype = NULL;
    }

    switch (dtmode)
    {
    case TidyDoctypeHtml5:
        guessed = HT50;
        break;
    case TidyDoctypeStrict:
        guessed = H41S;
        break;
    case TidyDoctypeLoose:
        guessed = H41T;
        break;
    case TidyDoctypeAuto:
        guessed = TY_(HTMLVersion)(doc);
        break;
    }

    lexer->versionEmitted = guessed;
    if (guessed == VERS_UNKNOWN)
        return no;

    if (doctype)
    {
        doctype->element = TY_(tmbstrtolower)(doctype->element);
    }
    else
    {
        doctype = NewDocTypeNode(doc);
        doctype->element = TY_(tmbstrdup)(doc->allocator, "html");
    }

    TY_(RepairAttrValue)(doc, doctype, "PUBLIC", GetFPIFromVers(guessed));

    if (hadSI)
        TY_(RepairAttrValue)(doc, doctype, "SYSTEM", GetSIFromVers(guessed));

    return yes;
}